

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadCameraLibrary(ColladaParser *this)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pCamera;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string id;
  allocator<char> local_59;
  key_type local_58;
  CameraLibrary *local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar2 != '\0')) {
    local_38 = &this->mCameraLibrary;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"camera");
        if (iVar2 == 0) {
          uVar4 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,(char *)CONCAT44(extraout_var_00,iVar2),&local_59);
          pCamera = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
                    ::operator[](local_38,&local_58);
          iVar2 = TestAttribute(this,"name");
          if (iVar2 != -1) {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            pcVar1 = (char *)(pCamera->mName)._M_string_length;
            strlen((char *)CONCAT44(extraout_var_01,iVar2));
            std::__cxx11::string::_M_replace
                      ((ulong)pCamera,0,pcVar1,CONCAT44(extraout_var_01,iVar2));
          }
          ReadCamera(this,pCamera);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"library_cameras");
        if (iVar2 == 0) {
          return;
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Expected end of <library_cameras> element.","");
        ThrowException(this,&local_58);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadCameraLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("camera"))
            {
                // read ID. By now you probably know my opinion about this "specification"
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                Camera& cam = mCameraLibrary[id];
                attrID = TestAttribute("name");
                if (attrID != -1)
                    cam.mName = mReader->getAttributeValue(attrID);

                ReadCamera(cam);

            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_cameras") != 0)
                ThrowException("Expected end of <library_cameras> element.");

            break;
        }
    }
}